

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_writer.cc
# Opt level: O1

ProtoElement * __thiscall
google::protobuf::util::converter::ProtoWriter::ProtoElement::pop(ProtoElement *this)

{
  ProtoWriter *pPVar1;
  undefined8 uVar2;
  size_t size;
  CodedOutputStream *this_00;
  int iVar3;
  _Rb_tree_node_base *p_Var4;
  int64 iVar5;
  undefined4 extraout_var;
  long *plVar6;
  ProtoElement *pPVar7;
  ulong uVar8;
  _Elt_pointer pSVar9;
  uint uVar10;
  LocationTrackerInterface *pLVar11;
  ulong uVar12;
  long lVar13;
  _Elt_pointer pSVar14;
  
  if (this->proto3_ == false) {
    for (p_Var4 = (this->required_fields_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(this->required_fields_)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      pPVar1 = this->ow_;
      uVar2 = **(undefined8 **)(*(long *)(p_Var4 + 1) + 0x28);
      size = (*(undefined8 **)(*(long *)(p_Var4 + 1) + 0x28))[1];
      if ((long)size < 0) {
        StringPiece::LogFatalSizeTooBig(size,"size_t to int conversion");
      }
      pPVar7 = (pPVar1->element_)._M_t.
               super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
               .
               super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>
               ._M_head_impl;
      if (pPVar7 == (ProtoElement *)0x0) {
        pLVar11 = (pPVar1->tracker_)._M_t.
                  super___uniq_ptr_impl<google::protobuf::util::converter::LocationTrackerInterface,_std::default_delete<google::protobuf::util::converter::LocationTrackerInterface>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_google::protobuf::util::converter::LocationTrackerInterface_*,_std::default_delete<google::protobuf::util::converter::LocationTrackerInterface>_>
                  .
                  super__Head_base<0UL,_google::protobuf::util::converter::LocationTrackerInterface_*,_false>
                  ._M_head_impl;
      }
      else {
        pLVar11 = &pPVar7->super_LocationTrackerInterface;
      }
      (*pPVar1->listener_->_vptr_ErrorListener[4])(pPVar1->listener_,pLVar11,uVar2,size);
    }
  }
  if (-1 < this->size_index_) {
    this_00 = (this->ow_->stream_)._M_t.
              super___uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
              ._M_t.
              super__Tuple_impl<0UL,_google::protobuf::io::CodedOutputStream_*,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
              .super__Head_base<0UL,_google::protobuf::io::CodedOutputStream_*,_false>._M_head_impl;
    iVar5 = io::EpsCopyOutputStream::ByteCount(&this_00->impl_,this_00->cur_);
    pPVar1 = this->ow_;
    pSVar9 = (pPVar1->size_insert_).
             super__Deque_base<google::protobuf::util::converter::ProtoWriter::SizeInfo,_std::allocator<google::protobuf::util::converter::ProtoWriter::SizeInfo>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    lVar13 = (long)this->size_index_;
    uVar8 = ((long)pSVar9 -
             (long)(pPVar1->size_insert_).
                   super__Deque_base<google::protobuf::util::converter::ProtoWriter::SizeInfo,_std::allocator<google::protobuf::util::converter::ProtoWriter::SizeInfo>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_first >> 3) + lVar13;
    if (uVar8 < 0x40) {
      pSVar14 = pSVar9 + lVar13;
    }
    else {
      uVar12 = uVar8 >> 6 | 0xfc00000000000000;
      if (0 < (long)uVar8) {
        uVar12 = uVar8 >> 6;
      }
      pSVar14 = (pPVar1->size_insert_).
                super__Deque_base<google::protobuf::util::converter::ProtoWriter::SizeInfo,_std::allocator<google::protobuf::util::converter::ProtoWriter::SizeInfo>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node[uVar12] + uVar8 + uVar12 * -0x40;
    }
    pSVar14->size = pSVar14->size + ((int)iVar5 - (int)this_00->start_count_);
    if (uVar8 < 0x40) {
      pSVar9 = pSVar9 + lVar13;
    }
    else {
      uVar12 = uVar8 >> 6 | 0xfc00000000000000;
      if (0 < (long)uVar8) {
        uVar12 = uVar8 >> 6;
      }
      pSVar9 = (pPVar1->size_insert_).
               super__Deque_base<google::protobuf::util::converter::ProtoWriter::SizeInfo,_std::allocator<google::protobuf::util::converter::ProtoWriter::SizeInfo>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node[uVar12] + uVar8 + uVar12 * -0x40;
    }
    uVar10 = pSVar9->size;
    iVar3 = (*(this->super_BaseElement)._vptr_BaseElement[2])(this);
    plVar6 = (long *)CONCAT44(extraout_var,iVar3);
    if (plVar6 != (long *)0x0) {
      uVar10 = uVar10 | 1;
      iVar3 = 0x1f;
      if (uVar10 != 0) {
        for (; uVar10 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      do {
        lVar13 = (long)(int)plVar6[0xf];
        if (-1 < lVar13) {
          pPVar1 = this->ow_;
          pSVar9 = (pPVar1->size_insert_).
                   super__Deque_base<google::protobuf::util::converter::ProtoWriter::SizeInfo,_std::allocator<google::protobuf::util::converter::ProtoWriter::SizeInfo>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur;
          uVar8 = ((long)pSVar9 -
                   (long)(pPVar1->size_insert_).
                         super__Deque_base<google::protobuf::util::converter::ProtoWriter::SizeInfo,_std::allocator<google::protobuf::util::converter::ProtoWriter::SizeInfo>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_first >> 3) + lVar13;
          if (uVar8 < 0x40) {
            pSVar9 = pSVar9 + lVar13;
          }
          else {
            uVar12 = uVar8 >> 6 | 0xfc00000000000000;
            if (0 < (long)uVar8) {
              uVar12 = uVar8 >> 6;
            }
            pSVar9 = (pPVar1->size_insert_).
                     super__Deque_base<google::protobuf::util::converter::ProtoWriter::SizeInfo,_std::allocator<google::protobuf::util::converter::ProtoWriter::SizeInfo>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_node[uVar12] +
                     uVar8 + uVar12 * -0x40;
          }
          pSVar9->size = pSVar9->size + (iVar3 * 9 + 0x49U >> 6);
        }
        plVar6 = (long *)(**(code **)(*plVar6 + 0x10))(plVar6);
      } while (plVar6 != (long *)0x0);
    }
  }
  pPVar7 = StructuredObjectWriter::BaseElement::
           pop<google::protobuf::util::converter::ProtoWriter::ProtoElement>
                     (&this->super_BaseElement);
  return pPVar7;
}

Assistant:

ProtoWriter::ProtoElement* ProtoWriter::ProtoElement::pop() {
  if (!proto3_) {
    // Calls the registered error listener for any required field(s) not yet
    // seen.
    for (std::set<const google::protobuf::Field*>::iterator it =
             required_fields_.begin();
         it != required_fields_.end(); ++it) {
      ow_->MissingField((*it)->name());
    }
  }
  // Computes the total number of proto bytes used by a message, also adjusts
  // the size of all parent messages by the length of this size field.
  // If size_index_ < 0, this is not a message, so no size field is added.
  if (size_index_ >= 0) {
    // Add the final buffer position to compute the total length of this
    // serialized message. The stored value (before this addition) already
    // contains the total length of the size fields of all nested messages
    // minus the initial buffer position.
    ow_->size_insert_[size_index_].size += ow_->stream_->ByteCount();
    // Calculate the length required to serialize the size field of the
    // message, and propagate this additional size information upward to
    // all enclosing messages.
    int size = ow_->size_insert_[size_index_].size;
    int length = CodedOutputStream::VarintSize32(size);
    for (ProtoElement* e = parent(); e != nullptr; e = e->parent()) {
      // Only nested messages have size field, lists do not have size field.
      if (e->size_index_ >= 0) {
        ow_->size_insert_[e->size_index_].size += length;
      }
    }
  }
  return BaseElement::pop<ProtoElement>();
}